

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

void __thiscall Rml::BaseXMLParser::ReadBody(BaseXMLParser *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined1 local_38 [8];
  String temp;
  size_t xml_index_tag;
  BaseXMLParser *this_local;
  
  this->open_tag_depth = 0;
  this->line_number_open_tag = 0;
LAB_004ba192:
  do {
    bVar1 = FindString(this,"<",&this->data,true);
    if (!bVar1) goto LAB_004ba2db;
    temp.field_2._8_8_ = this->xml_index - 1;
    bVar1 = PeekString(this,"!--",true);
    if (bVar1) {
      ::std::__cxx11::string::string((string *)local_38);
      bVar1 = FindString(this,"-->",(String *)local_38,false);
      ::std::__cxx11::string::~string((string *)local_38);
    }
    else {
      bVar1 = PeekString(this,"![CDATA[",true);
      if (bVar1) {
        bVar1 = ReadCDATA(this,(char *)0x0);
      }
      else {
        bVar1 = PeekString(this,"/",true);
        if (bVar1) {
          bVar1 = ReadCloseTag(this,temp.field_2._8_8_);
          if ((!bVar1) || (this->open_tag_depth == 0)) goto LAB_004ba2db;
          goto LAB_004ba192;
        }
        bVar1 = ReadOpenTag(this);
      }
    }
    if (!bVar1) {
LAB_004ba2db:
      if (0 < this->open_tag_depth) {
        uVar2 = GetLineNumber(this);
        URL::GetURL_abi_cxx11_(this->source_url);
        uVar3 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"XML parse error on line %d of %s.",(ulong)uVar2,uVar3);
      }
      return;
    }
  } while( true );
}

Assistant:

void BaseXMLParser::ReadBody()
{
	RMLUI_ZoneScoped;

	open_tag_depth = 0;
	line_number_open_tag = 0;

	for (;;)
	{
		// Find the next open tag.
		if (!FindString("<", data, true))
			break;

		const size_t xml_index_tag = xml_index - 1;

		// Check what kind of tag this is.
		if (PeekString("!--"))
		{
			// Comment.
			String temp;
			if (!FindString("-->", temp))
				break;
		}
		else if (PeekString("![CDATA["))
		{
			// CDATA tag; read everything (including markup) until the ending
			// CDATA tag.
			if (!ReadCDATA())
				break;
		}
		else if (PeekString("/"))
		{
			if (!ReadCloseTag(xml_index_tag))
				break;

			// Bail if we've hit the end of the XML data.
			if (open_tag_depth == 0)
				break;
		}
		else
		{
			if (!ReadOpenTag())
				break;
		}
	}

	// Check for error conditions
	if (open_tag_depth > 0)
	{
		Log::Message(Log::LT_WARNING, "XML parse error on line %d of %s.", GetLineNumber(), source_url->GetURL().c_str());
	}
}